

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

void check_and_fix(Am_Value_List *list,Am_Object *inter)

{
  bool bVar1;
  Am_Value *in_value;
  ostream *poVar2;
  Am_Value item;
  Am_Value local_30;
  
  local_30.type = 0;
  local_30.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Start(list);
  do {
    bVar1 = Am_Value_List::Last(list);
    if (bVar1) {
LAB_0024fe15:
      Am_Value::~Am_Value(&local_30);
      return;
    }
    in_value = Am_Value_List::Get(list);
    Am_Value::operator=(&local_30,in_value);
    if (local_30.type == 0x8008) {
      do_fix_all(list,inter);
      goto LAB_0024fe15;
    }
    if (local_30.type != Am_Input_Char::Am_Input_Char_ID) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"item in Am_SELECTION_MOVE_CHARS of ",0x23);
      poVar2 = operator<<((ostream *)&std::cerr,inter);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," is not a string or Am_Input_Char, is : ",0x28);
      poVar2 = operator<<(poVar2,&local_30);
      std::endl<char,std::char_traits<char>>(poVar2);
      Am_Error();
    }
    Am_Value_List::Next(list);
  } while( true );
}

Assistant:

void
check_and_fix(Am_Value_List &list, Am_Object &inter)
{
  Am_Value item;
  for (list.Start(); !list.Last(); list.Next()) {
    item = list.Get();
    if (item.type == Am_STRING) {
      do_fix_all(list, inter);
      return;
    } else if (!Am_Input_Char::Test(item))
      Am_ERRORO("item in Am_SELECTION_MOVE_CHARS of "
                    << inter
                    << " is not a string or Am_Input_Char, is : " << item,
                inter, Am_SELECTION_MOVE_CHARS);
  }
}